

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml.hpp
# Opt level: O0

xml_attribute<char> * __thiscall
rapidxml::xml_node<char>::first_attribute
          (xml_node<char> *this,char *name,size_t name_size,bool case_sensitive)

{
  bool bVar1;
  char *p1;
  size_t size1;
  xml_attribute<char> *local_38;
  xml_attribute<char> *attribute;
  size_t sStack_28;
  bool case_sensitive_local;
  size_t name_size_local;
  char *name_local;
  xml_node<char> *this_local;
  
  if (name == (char *)0x0) {
    this_local = (xml_node<char> *)this->m_first_attribute;
  }
  else {
    sStack_28 = name_size;
    if (name_size == 0) {
      sStack_28 = internal::measure<char>(name);
    }
    for (local_38 = this->m_first_attribute; local_38 != (xml_attribute<char> *)0x0;
        local_38 = local_38->m_next_attribute) {
      p1 = xml_base<char>::name(&local_38->super_xml_base<char>);
      size1 = xml_base<char>::name_size(&local_38->super_xml_base<char>);
      bVar1 = internal::compare<char>(p1,size1,name,sStack_28,case_sensitive);
      if (bVar1) {
        return local_38;
      }
    }
    this_local = (xml_node<char> *)0x0;
  }
  return (xml_attribute<char> *)this_local;
}

Assistant:

xml_attribute<Ch> *first_attribute(const Ch *name = 0, std::size_t name_size = 0, bool case_sensitive = true) const
        {
            if (name)
            {
                if (name_size == 0)
                    name_size = internal::measure(name);
                for (xml_attribute<Ch> *attribute = m_first_attribute; attribute; attribute = attribute->m_next_attribute)
                    if (internal::compare(attribute->name(), attribute->name_size(), name, name_size, case_sensitive))
                        return attribute;
                return 0;
            }
            else
                return m_first_attribute;
        }